

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_manager.cpp
# Opt level: O2

unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true> __thiscall
duckdb::SecretManager::RegisterSecretInternal
          (SecretManager *this,CatalogTransaction transaction,
          unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
          *secret,OnCreateConflict on_conflict,SecretPersistType persist_type,string *storage)

{
  bool bVar1;
  pointer pBVar2;
  SecretStorage *pSVar3;
  InvalidInputException *pIVar4;
  undefined7 in_register_00000011;
  unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true> *this_00
  ;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  char cVar5;
  allocator local_112;
  allocator local_111;
  _Head_base<0UL,_const_duckdb::BaseSecret_*,_false> local_110;
  string local_108;
  optional_ptr<duckdb::SecretStorage,_true> backend;
  string resolved_storage;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  SecretType local_98;
  
  this_00 = (unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
             *)CONCAT71(in_register_00000011,on_conflict);
  cVar5 = (char)storage;
  pBVar2 = unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
           ::operator->(this_00);
  LookupTypeInternal(&local_98,(SecretManager *)secret,&pBVar2->type);
  SecretType::~SecretType(&local_98);
  if ((int)storage == 0) {
    if (in_R9->_M_string_length == 0) {
      cVar5 = *(char *)&secret[0x1c].
                        super_unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                        ._M_t.
                        super___uniq_ptr_impl<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_const_duckdb::BaseSecret_*,_std::default_delete<const_duckdb::BaseSecret>_>
                        .super__Head_base<0UL,_const_duckdb::BaseSecret_*,_false>._M_head_impl;
    }
    else {
      bVar1 = ::std::operator==(in_R9,"memory");
      cVar5 = '\x02' - bVar1;
    }
  }
  resolved_storage._M_dataplus._M_p = (pointer)&resolved_storage.field_2;
  resolved_storage._M_string_length = 0;
  resolved_storage.field_2._M_local_buf[0] = '\0';
  if (in_R9->_M_string_length == 0) {
    if (cVar5 == '\x02') {
      ::std::__cxx11::string::string((string *)&local_108,(string *)(secret + 0x25));
    }
    else {
      ::std::__cxx11::string::string((string *)&local_108,"memory",&local_111);
    }
    ::std::__cxx11::string::operator=((string *)&resolved_storage,(string *)&local_108);
    ::std::__cxx11::string::~string((string *)&local_108);
  }
  else {
    ::std::__cxx11::string::_M_assign((string *)&resolved_storage);
  }
  backend = GetSecretStorage((SecretManager *)secret,&resolved_storage);
  if (backend.ptr != (SecretStorage *)0x0) {
    if (cVar5 == '\x02') {
      pSVar3 = optional_ptr<duckdb::SecretStorage,_true>::operator->(&backend);
      if (pSVar3->persistent != true) {
        pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_108,
                   "Cannot create persistent secrets in a temporary secret storage!",&local_112);
        InvalidInputException::InvalidInputException(pIVar4,&local_108);
        __cxa_throw(pIVar4,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (*(char *)&secret[0x29].
                    super_unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                    ._M_t.
                    super___uniq_ptr_impl<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_const_duckdb::BaseSecret_*,_std::default_delete<const_duckdb::BaseSecret>_>
                    .super__Head_base<0UL,_const_duckdb::BaseSecret_*,_false>._M_head_impl == '\0')
      {
        pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_108,
                   "Persistent secrets are currently disabled. To enable them, restart duckdb and run \'SET allow_persistent_secrets=true\'"
                   ,&local_112);
        InvalidInputException::InvalidInputException(pIVar4,&local_108);
        __cxa_throw(pIVar4,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    else {
      pSVar3 = optional_ptr<duckdb::SecretStorage,_true>::operator->(&backend);
      if (pSVar3->persistent == true) {
        pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_108,
                   "Cannot create temporary secrets in a persistent secret storage!",&local_112);
        InvalidInputException::InvalidInputException(pIVar4,&local_108);
        __cxa_throw(pIVar4,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    pSVar3 = optional_ptr<duckdb::SecretStorage,_true>::operator->(&backend);
    local_110._M_head_impl =
         (this_00->
         super_unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>)
         ._M_t.
         super___uniq_ptr_impl<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
         ._M_t.
         super__Tuple_impl<0UL,_const_duckdb::BaseSecret_*,_std::default_delete<const_duckdb::BaseSecret>_>
         .super__Head_base<0UL,_const_duckdb::BaseSecret_*,_false>._M_head_impl;
    (this_00->
    super_unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>)._M_t
    .super___uniq_ptr_impl<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
    ._M_t.
    super__Tuple_impl<0UL,_const_duckdb::BaseSecret_*,_std::default_delete<const_duckdb::BaseSecret>_>
    .super__Head_base<0UL,_const_duckdb::BaseSecret_*,_false>._M_head_impl = (BaseSecret *)0x0;
    (*pSVar3->_vptr_SecretStorage[3])(this,pSVar3,&local_110,(ulong)persist_type,&transaction);
    if (local_110._M_head_impl != (BaseSecret *)0x0) {
      (*(local_110._M_head_impl)->_vptr_BaseSecret[1])();
    }
    local_110._M_head_impl = (BaseSecret *)0x0;
    ::std::__cxx11::string::~string((string *)&resolved_storage);
    return (unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>)
           (unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>)this;
  }
  if (*(char *)&secret[0x29].
                super_unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                ._M_t.
                super___uniq_ptr_impl<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                ._M_t.
                super__Tuple_impl<0UL,_const_duckdb::BaseSecret_*,_std::default_delete<const_duckdb::BaseSecret>_>
                .super__Head_base<0UL,_const_duckdb::BaseSecret_*,_false>._M_head_impl != '\0') {
LAB_004242c8:
    pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_108,"Secret storage \'%s\' not found!",&local_112);
    ::std::__cxx11::string::string((string *)&local_b8,(string *)&resolved_storage);
    InvalidInputException::InvalidInputException<std::__cxx11::string>(pIVar4,&local_108,&local_b8);
    __cxa_throw(pIVar4,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (cVar5 != '\x02') {
    bVar1 = ::std::operator==(in_R9,"local_file");
    if (!bVar1) goto LAB_004242c8;
  }
  pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_108,
             "Persistent secrets are disabled. Restart DuckDB and enable persistent secrets through \'SET allow_persistent_secrets=true\'"
             ,&local_112);
  InvalidInputException::InvalidInputException(pIVar4,&local_108);
  __cxa_throw(pIVar4,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<SecretEntry> SecretManager::RegisterSecretInternal(CatalogTransaction transaction,
                                                              unique_ptr<const BaseSecret> secret,
                                                              OnCreateConflict on_conflict,
                                                              SecretPersistType persist_type, const string &storage) {
	//! Ensure we only create secrets for known types;
	LookupTypeInternal(secret->GetType());

	//! Handle default for persist type
	if (persist_type == SecretPersistType::DEFAULT) {
		if (storage.empty()) {
			persist_type = config.default_persist_type;
		} else if (storage == TEMPORARY_STORAGE_NAME) {
			persist_type = SecretPersistType::TEMPORARY;
		} else {
			persist_type = SecretPersistType::PERSISTENT;
		}
	}

	//! Resolve storage
	string resolved_storage;
	if (storage.empty()) {
		resolved_storage =
		    persist_type == SecretPersistType::PERSISTENT ? config.default_persistent_storage : TEMPORARY_STORAGE_NAME;
	} else {
		resolved_storage = storage;
	}

	//! Lookup which backend to store the secret in
	auto backend = GetSecretStorage(resolved_storage);
	if (!backend) {
		if (!config.allow_persistent_secrets &&
		    (persist_type == SecretPersistType::PERSISTENT || storage == LOCAL_FILE_STORAGE_NAME)) {
			throw InvalidInputException("Persistent secrets are disabled. Restart DuckDB and enable persistent secrets "
			                            "through 'SET allow_persistent_secrets=true'");
		}
		throw InvalidInputException("Secret storage '%s' not found!", resolved_storage);
	}

	// Validation on both allow_persistent_secrets and storage backend's own persist type
	if (persist_type == SecretPersistType::PERSISTENT) {
		if (backend->persistent) {
			if (!config.allow_persistent_secrets) {
				throw InvalidInputException(
				    "Persistent secrets are currently disabled. To enable them, restart duckdb and "
				    "run 'SET allow_persistent_secrets=true'");
			}
		} else { // backend is temp
			throw InvalidInputException("Cannot create persistent secrets in a temporary secret storage!");
		}
	} else { // SecretPersistType::TEMPORARY
		if (backend->persistent) {
			throw InvalidInputException("Cannot create temporary secrets in a persistent secret storage!");
		}
	}
	return backend->StoreSecret(std::move(secret), on_conflict, &transaction);
}